

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_block_flattened(CompilerGLSL *this,SPIRVariable *var)

{
  AlignedBuffer<unsigned_int,_8UL> *pAVar1;
  AlignedBuffer<bool,_8UL> *pAVar2;
  AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *pAVar3;
  AlignedBuffer<unsigned_int,_8UL> *pAVar4;
  bool bVar5;
  SPIRType *type;
  size_t sVar6;
  runtime_error *prVar7;
  BaseType basic_type;
  size_t buffer_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  string buffer_name;
  Bitset flags;
  SPIRType tmp;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (&buffer_name,this,(ulong)(type->super_IVariant).self.id,0);
  sVar6 = Compiler::get_declared_struct_size(&this->super_Compiler,type);
  buffer_size = sVar6 + 0xf >> 4;
  bVar5 = Compiler::get_common_basic_type(&this->super_Compiler,type,&basic_type);
  if (!bVar5) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar7,"All basic types in a flattened block must be the same.");
    *(undefined ***)prVar7 = &PTR__runtime_error_0050aef0;
    __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pAVar1 = &tmp.array.stack_storage;
  tmp.super_IVariant.self.id = 0;
  tmp.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0050af18;
  tmp.columns = 1;
  tmp.array.super_VectorView<unsigned_int>.buffer_size = 0;
  tmp.array.buffer_capacity = 8;
  pAVar2 = &tmp.array_size_literal.stack_storage;
  tmp.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  tmp.array_size_literal.buffer_capacity = 8;
  tmp.pointer_depth = 0;
  tmp.pointer = false;
  tmp.forward_pointer = false;
  tmp.storage = Generic;
  pAVar3 = &tmp.member_types.stack_storage;
  tmp.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  tmp.member_types.buffer_capacity = 8;
  pAVar4 = &tmp.member_type_index_redirection.stack_storage;
  tmp.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  tmp.member_type_index_redirection.buffer_capacity = 8;
  tmp.member_name_cache._M_h._M_buckets = &tmp.member_name_cache._M_h._M_single_bucket;
  tmp.image._0_7_ = 0;
  tmp.image._7_4_ = 0;
  tmp.parent_type.id = 0;
  tmp.image.sampled = 0;
  tmp.image.format = ImageFormatUnknown;
  tmp.image.access = AccessQualifierReadOnly;
  tmp.type_alias.id = 0;
  tmp.member_name_cache._M_h._M_bucket_count = 1;
  tmp.member_name_cache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tmp.member_name_cache._M_h._M_element_count = 0;
  tmp.member_name_cache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tmp.member_name_cache._M_h._M_rehash_policy._M_next_resize = 0;
  tmp.member_name_cache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tmp.basetype = basic_type;
  tmp.super_IVariant._12_4_ = 0x17;
  tmp.width = 0;
  tmp.vecsize = 4;
  tmp.array.super_VectorView<unsigned_int>.ptr = (uint *)pAVar1;
  tmp.array_size_literal.super_VectorView<bool>.ptr = (bool *)pAVar2;
  tmp.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)pAVar3;
  tmp.member_type_index_redirection.super_VectorView<unsigned_int>.ptr = (uint *)pAVar4;
  if ((1 < basic_type - Int) && (basic_type != Float)) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar7,"Basic types in a flattened UBO must be float, int or uint.");
    *(undefined ***)prVar7 = &PTR__runtime_error_0050aef0;
    __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ParsedIR::get_buffer_block_flags(&flags,&(this->super_Compiler).ir,var);
  flags_to_qualifiers_glsl_abi_cxx11_(&local_200,this,&tmp,&flags);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_220,this,&tmp,0);
  statement<char_const(&)[9],std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_long&,char_const(&)[3]>
            (this,(char (*) [9])"uniform ",&local_200,&local_220,(char (*) [2])0x3d8129,&buffer_name
             ,(char (*) [2])0x3b5810,&buffer_size,(char (*) [3])0x3f4a35);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  tmp.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0050af18;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&tmp.member_name_cache._M_h);
  tmp.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      tmp.member_type_index_redirection.super_VectorView<unsigned_int>.ptr != pAVar4) {
    free(tmp.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  tmp.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      tmp.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr != pAVar3)
  {
    free(tmp.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
  }
  tmp.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)tmp.array_size_literal.super_VectorView<bool>.ptr != pAVar2) {
    free(tmp.array_size_literal.super_VectorView<bool>.ptr);
  }
  tmp.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)tmp.array.super_VectorView<unsigned_int>.ptr != pAVar1) {
    free(tmp.array.super_VectorView<unsigned_int>.ptr);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buffer_name._M_dataplus._M_p != &buffer_name.field_2) {
    operator_delete(buffer_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block_flattened(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	// Block names should never alias.
	auto buffer_name = to_name(type.self, false);
	size_t buffer_size = (get_declared_struct_size(type) + 15) / 16;

	SPIRType::BaseType basic_type;
	if (get_common_basic_type(type, basic_type))
	{
		SPIRType tmp { OpTypeVector };
		tmp.basetype = basic_type;
		tmp.vecsize = 4;
		if (basic_type != SPIRType::Float && basic_type != SPIRType::Int && basic_type != SPIRType::UInt)
			SPIRV_CROSS_THROW("Basic types in a flattened UBO must be float, int or uint.");

		auto flags = ir.get_buffer_block_flags(var);
		statement("uniform ", flags_to_qualifiers_glsl(tmp, flags), type_to_glsl(tmp), " ", buffer_name, "[",
		          buffer_size, "];");
	}
	else
		SPIRV_CROSS_THROW("All basic types in a flattened block must be the same.");
}